

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_cheat.cpp
# Opt level: O0

void cht_DoCheat(player_t *player,int cheat)

{
  double dVar1;
  APlayerPawn *angle;
  APlayerPawn *pAVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  DWORD DVar6;
  int iVar7;
  PClassPlayerPawn *morphclass;
  AInventory *pAVar8;
  AActor *pAVar9;
  FState *state;
  VMFrameStack *this;
  PClassActor *pPVar10;
  AWeapon *pAVar11;
  char *pcVar12;
  byte bVar13;
  ENamedName name;
  VMValue *local_198;
  int local_124;
  undefined1 local_120 [4];
  int oldpieces;
  VMReturn ret;
  undefined1 local_f8 [8];
  VMValue params [1];
  FName local_dc;
  TAngle<double> local_d8;
  undefined1 local_d0 [16];
  TAngle<double> local_c0;
  int local_b4;
  char *pcStack_b0;
  int i_2;
  AWeapon *weap;
  AInventory **lastinvp;
  AInventory **invp;
  TFlags<ActorFlag2,_unsigned_int> local_90;
  int i_1;
  TFlags<ActorFlag7,_unsigned_int> local_88;
  TFlags<ActorFlag6,_unsigned_int> local_84;
  TFlags<ActorFlag5,_unsigned_int> local_80;
  TFlags<ActorFlag4,_unsigned_int> local_7c;
  TFlags<ActorFlag3,_unsigned_int> local_78;
  TFlags<ActorFlag2,_unsigned_int> local_74;
  TFlags<ActorFlag,_unsigned_int> local_70;
  uint local_6c;
  Self local_68;
  int killcount;
  TFlags<ActorFlag7,_unsigned_int> local_60;
  int local_5c;
  char local_58 [4];
  int i;
  char msgbuild [32];
  char *local_30;
  char *msg;
  AInventory *item;
  PClassActor *type;
  int cheat_local;
  player_t *player_local;
  
  local_30 = "";
  switch(cheat) {
  case 1:
    player->cheats = player->cheats ^ 1;
    if ((player->cheats & 1U) == 0) {
      local_30 = FStringTable::operator()(&GStrings,"STSTR_NCOFF");
    }
    else {
      local_30 = FStringTable::operator()(&GStrings,"STSTR_NCON");
    }
    break;
  case 2:
    player->cheats = player->cheats ^ 8;
    if ((player->cheats & 8U) == 0) {
      local_30 = "notarget OFF";
    }
    else {
      local_30 = "notarget ON";
    }
    break;
  case 3:
    if ((player->mo != (APlayerPawn *)0x0) && (-1 < player->health)) {
      pPVar10 = PClass::FindActor("Chainsaw");
      pAVar8 = AActor::FindInventory(&player->mo->super_AActor,pPVar10,false);
      if (pAVar8 == (AInventory *)0x0) {
        AActor::GiveInventoryType(&player->mo->super_AActor,pPVar10);
      }
      local_30 = FStringTable::operator()(&GStrings,"STSTR_CHOPPERS");
    }
    break;
  case 4:
    cht_Give(player,"backpack",1);
    cht_Give(player,"weapons",1);
    cht_Give(player,"ammo",1);
    cht_Give(player,"keys",1);
    cht_Give(player,"armor",1);
    local_30 = FStringTable::operator()(&GStrings,"STSTR_KFAADDED");
    break;
  case 5:
    cht_Give(player,"backpack",1);
    cht_Give(player,"weapons",1);
    cht_Give(player,"ammo",1);
    cht_Give(player,"armor",1);
    local_30 = FStringTable::operator()(&GStrings,"STSTR_FAADDED");
    break;
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
    local_5c = cheat + -6;
    if (local_5c == 4) {
      level.flags2 = level.flags2 ^ 2;
    }
    else if ((player->mo != (APlayerPawn *)0x0) && (-1 < player->health)) {
      pAVar2 = player->mo;
      pPVar10 = PClass::FindActor(cht_DoCheat::BeholdPowers[local_5c]);
      pAVar8 = AActor::FindInventory(&pAVar2->super_AActor,pPVar10,false);
      if (pAVar8 == (AInventory *)0x0) {
        if (local_5c == 0) {
          cht_Give(player,"InvulnerabilitySphere",1);
        }
        else {
          cht_Give(player,cht_DoCheat::BeholdPowers[local_5c],1);
          if (cheat == 7) {
            P_GiveBody(&player->mo->super_AActor,-100,0);
          }
        }
      }
      else {
        (*(pAVar8->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
      }
    }
    local_30 = FStringTable::operator()(&GStrings,"STSTR_BEHOLDX");
    break;
  case 0xf:
    cht_Give(player,"MedPatch",1);
    cht_Give(player,"MedicalKit",1);
    cht_Give(player,"SurgeryKit",1);
    local_30 = FStringTable::operator()(&GStrings,"TXT_GOTSTUFF");
    break;
  case 0x10:
    cht_Give(player,"AmmoSatchel",1);
    local_30 = FStringTable::operator()(&GStrings,"TXT_GOTSTUFF");
    break;
  case 0x11:
    cht_Give(player,"UpgradeStamina",10);
    cht_Give(player,"UpgradeAccuracy",1);
    local_30 = FStringTable::operator()(&GStrings,"TXT_GOTSTUFF");
    break;
  case 0x12:
    if (((player->cheats & 2U) == 0) && (player->playerstate == '\0')) {
      if (player->mo != (APlayerPawn *)0x0) {
        (player->mo->super_AActor).health = deh.GodHealth;
      }
      player->health = deh.GodHealth;
    }
  case 0:
    player->cheats = player->cheats ^ 2;
    if ((player->cheats & 2U) == 0) {
      local_30 = FStringTable::operator()(&GStrings,"STSTR_DQDOFF");
    }
    else {
      local_30 = FStringTable::operator()(&GStrings,"STSTR_DQDON");
    }
    ST_SetNeedRefresh();
    break;
  case 0x13:
    local_6c = P_Massacre();
    pcVar12 = "s";
    if (local_6c == 1) {
      pcVar12 = "";
    }
    mysnprintf(local_58,0x20,"%d Monster%s Killed",(ulong)local_6c,pcVar12);
    local_30 = local_58;
    break;
  case 0x14:
    player->cheats = player->cheats ^ 0x20;
    if ((player->cheats & 0x20U) == 0) {
      local_30 = "chasecam OFF";
    }
    else {
      local_30 = "chasecam ON";
    }
    R_ResetViewInterpolation();
    break;
  case 0x15:
    if (player->mo != (APlayerPawn *)0x0) {
      TFlags<ActorFlag7,_unsigned_int>::operator^=(&(player->mo->super_AActor).flags7,MF7_FLYCHEAT);
      TFlags<ActorFlag7,_unsigned_int>::operator&
                (&local_60,
                 (int)player->mo +
                 (MF7_DONTTHRUST|MF7_FOILBUDDHA|MF7_BUDDHA|MF7_WEAPONSPAWN|MF7_ALWAYSTELEFRAG));
      uVar5 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_60);
      if (uVar5 == 0) {
        operator~((EnumType)&killcount);
        TFlags<ActorFlag,_unsigned_int>::operator&=
                  (&(player->mo->super_AActor).flags,(Self *)&killcount);
        operator~((EnumType)&local_68);
        TFlags<ActorFlag2,_unsigned_int>::operator&=(&(player->mo->super_AActor).flags2,&local_68);
        local_30 = FStringTable::operator()(&GStrings,"TXT_GRAVITY");
      }
      else {
        TFlags<ActorFlag,_unsigned_int>::operator|=(&(player->mo->super_AActor).flags,MF_NOGRAVITY);
        TFlags<ActorFlag2,_unsigned_int>::operator|=(&(player->mo->super_AActor).flags2,MF2_FLY);
        local_30 = FStringTable::operator()(&GStrings,"TXT_LIGHTER");
      }
    }
    break;
  case 0x16:
    name = NAME_PigPlayer;
    if (gameinfo.gametype == GAME_Heretic) {
      name = NAME_ChickenPlayer;
    }
    morphclass = (PClassPlayerPawn *)PClass::FindClass(name);
    local_30 = cht_Morph(player,morphclass,true);
    break;
  case 0x17:
    if ((player->mo != (APlayerPawn *)0x0) && (-1 < player->health)) {
      pAVar8 = AActor::FindInventory
                         (&player->mo->super_AActor,
                          (PClassActor *)APowerWeaponLevel2::RegistrationInfo.MyClass,true);
      if (pAVar8 == (AInventory *)0x0) {
        AActor::GiveInventoryType
                  (&player->mo->super_AActor,
                   (PClassActor *)APowerWeaponLevel2::RegistrationInfo.MyClass);
        local_30 = FStringTable::operator()(&GStrings,"TXT_CHEATPOWERON");
      }
      else {
        (*(pAVar8->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
        local_30 = FStringTable::operator()(&GStrings,"TXT_CHEATPOWEROFF");
      }
    }
    break;
  case 0x18:
    if ((player->mo != (APlayerPawn *)0x0) && (player->playerstate == '\0')) {
      pAVar9 = AActor::GetDefault(&player->mo->super_AActor);
      iVar7 = pAVar9->health;
      (player->mo->super_AActor).health = iVar7;
      player->health = iVar7;
      local_30 = FStringTable::operator()(&GStrings,"TXT_CHEATHEALTH");
    }
    break;
  case 0x19:
    cht_Give(player,"keys",1);
    local_30 = FStringTable::operator()(&GStrings,"TXT_CHEATKEYS");
    break;
  case 0x1a:
    if (player->morphTics != 0) {
      return;
    }
    if (player->mo == (APlayerPawn *)0x0) {
      return;
    }
    if ((player->mo->super_AActor).health < 1) {
      return;
    }
    lastinvp = TObjPtr<AInventory>::operator&(&(player->mo->super_AActor).Inventory);
    msg = (char *)*lastinvp;
    while (msg != (char *)0x0) {
      weap = (AWeapon *)lastinvp;
      lastinvp = TObjPtr<AInventory>::operator&(&((*lastinvp)->super_AActor).Inventory);
      bVar3 = DObject::IsKindOf((DObject *)msg,AWeapon::RegistrationInfo.MyClass);
      if ((bVar3) &&
         ((pcStack_b0 = msg, (*(uint *)(msg + 0x4fc) & 0x200) == 0 || (*(long *)(msg + 0x500) != 0))
         )) {
        (**(code **)(*(long *)msg + 0x20))();
        lastinvp = (AInventory **)weap;
      }
      msg = (char *)*lastinvp;
    }
    local_30 = FStringTable::operator()(&GStrings,"TXT_CHEATIDKFA");
    break;
  case 0x1b:
    cht_Suicide(player);
    local_30 = FStringTable::operator()(&GStrings,"TXT_CHEATIDDQD");
    break;
  case 0x1c:
    for (local_b4 = 0; local_b4 < 0x19; local_b4 = local_b4 + 1) {
      cht_Give(player,"artifacts",1);
    }
    local_30 = FStringTable::operator()(&GStrings,"TXT_CHEATARTIFACTS3");
    break;
  case 0x1d:
    cht_Give(player,"puzzlepieces",1);
    local_30 = FStringTable::operator()(&GStrings,"TXT_CHEATARTIFACTS3");
    break;
  case 0x1e:
    if (player->mo == (APlayerPawn *)0x0) {
      Printf("What do you want to kill outside of a game?\n");
    }
    else {
      iVar7 = FIntCVar::operator_cast_to_int(&deathmatch);
      if (iVar7 == 0) {
        pAVar2 = player->mo;
        TAngle<double>::TAngle(&local_c0,&(player->mo->super_AActor).Angles.Yaw);
        angle = player->mo;
        TAngle<double>::TAngle((TAngle<double> *)local_d0,&(player->mo->super_AActor).Angles.Yaw);
        TAngle<double>::TAngle(&local_d8,0.0);
        P_AimLineAttack((AActor *)(local_d0 + 8),(DAngle *)angle,8192.0,
                        (FTranslatedLineTarget *)local_d0,(DAngle *)0x0,(int)&local_d8,(AActor *)0x0
                        ,(AActor *)0x0);
        FName::FName(&local_dc,NAME_MDK);
        FName::FName((FName *)&stack0xffffffffffffff20,NAME_BulletPuff);
        P_LineAttack(&pAVar2->super_AActor,&local_c0,8192.0,(DAngle *)(local_d0 + 8),1000000,
                     &local_dc,(FName *)&stack0xffffffffffffff20,0,(FTranslatedLineTarget *)0x0,
                     (int *)0x0);
      }
    }
    break;
  case 0x1f:
    player->cheats = player->cheats ^ 0x400;
    if ((player->cheats & 0x400U) == 0) {
      local_30 = "No more ogre armor";
    }
    else {
      local_30 = "\"Quake with fear!\"";
    }
    break;
  case 0x20:
    player->cheats = player->cheats ^ 4;
    if ((player->cheats & 4U) == 0) {
      local_30 = FStringTable::operator()(&GStrings,"TXT_LEADBOOTSOFF");
    }
    else {
      local_30 = FStringTable::operator()(&GStrings,"TXT_LEADBOOTSON");
    }
    break;
  case 0x21:
    cht_Give(player,"HealthTraining",1);
    local_30 = FStringTable::operator()(&GStrings,"TXT_MIDASTOUCH");
    break;
  case 0x22:
    if ((player->mo != (APlayerPawn *)0x0) && (-1 < player->health)) {
      if (cht_DoCheat::gsp == (VMFunction *)0x0) {
        FName::FName((FName *)(params[0].field_0.biggest.foo + 3),NAME_Sigil);
        FName::FName((FName *)&params[0].field_0.field_1.atag,NAME_GiveSigilPiece);
        cht_DoCheat::gsp =
             PClass::FindFunction
                       ((FName *)(params[0].field_0.biggest.foo + 3),
                        (FName *)&params[0].field_0.field_1.atag);
      }
      if (cht_DoCheat::gsp != (VMFunction *)0x0) {
        VMValue::VMValue((VMValue *)local_f8,(DObject *)player->mo);
        local_124 = 1;
        VMReturn::IntAt((VMReturn *)local_120,&local_124);
        this = (VMFrameStack *)_ZTW13GlobalVMStack();
        VMFrameStack::Call(this,cht_DoCheat::gsp,(VMValue *)local_f8,1,(VMReturn *)local_120,1,
                           (VMException **)0x0);
        pAVar2 = player->mo;
        pPVar10 = PClass::FindActor(NAME_Sigil);
        pAVar11 = (AWeapon *)AActor::FindInventory(&pAVar2->super_AActor,pPVar10,false);
        if (pAVar11 != (AWeapon *)0x0) {
          if (local_124 == 5) {
            (*(pAVar11->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
              super_DObject._vptr_DObject[4])();
          }
          else {
            player->PendingWeapon = pAVar11;
          }
        }
        local_198 = (VMValue *)((long)&params[0].field_0 + 8);
        do {
          local_198 = local_198 + -1;
          VMValue::~VMValue(local_198);
        } while (local_198 != (VMValue *)local_f8);
      }
    }
    break;
  case 0x23:
    if ((player->playerstate != '\0') && (player->mo != (APlayerPawn *)0x0)) {
      bVar3 = DObject::IsKindOf((DObject *)player->mo,APlayerChunk::RegistrationInfo.MyClass);
      if (bVar3) {
        Printf("Unable to resurrect. Player is no longer connected to its body.\n");
      }
      else {
        player->playerstate = '\0';
        pAVar9 = AActor::GetDefault(&player->mo->super_AActor);
        iVar7 = pAVar9->health;
        (player->mo->super_AActor).health = iVar7;
        player->health = iVar7;
        pAVar9 = AActor::GetDefault(&player->mo->super_AActor);
        player->viewheight = (double)pAVar9[1].sprev;
        pAVar9 = AActor::GetDefault(&player->mo->super_AActor);
        TFlags<ActorFlag,_unsigned_int>::TFlags(&local_70,&pAVar9->flags);
        TFlags<ActorFlag,_unsigned_int>::operator=(&(player->mo->super_AActor).flags,&local_70);
        pAVar9 = AActor::GetDefault(&player->mo->super_AActor);
        TFlags<ActorFlag2,_unsigned_int>::TFlags(&local_74,&pAVar9->flags2);
        TFlags<ActorFlag2,_unsigned_int>::operator=(&(player->mo->super_AActor).flags2,&local_74);
        pAVar9 = AActor::GetDefault(&player->mo->super_AActor);
        TFlags<ActorFlag3,_unsigned_int>::TFlags(&local_78,&pAVar9->flags3);
        TFlags<ActorFlag3,_unsigned_int>::operator=(&(player->mo->super_AActor).flags3,&local_78);
        pAVar9 = AActor::GetDefault(&player->mo->super_AActor);
        TFlags<ActorFlag4,_unsigned_int>::TFlags(&local_7c,&pAVar9->flags4);
        TFlags<ActorFlag4,_unsigned_int>::operator=(&(player->mo->super_AActor).flags4,&local_7c);
        pAVar9 = AActor::GetDefault(&player->mo->super_AActor);
        TFlags<ActorFlag5,_unsigned_int>::TFlags(&local_80,&pAVar9->flags5);
        TFlags<ActorFlag5,_unsigned_int>::operator=(&(player->mo->super_AActor).flags5,&local_80);
        pAVar9 = AActor::GetDefault(&player->mo->super_AActor);
        TFlags<ActorFlag6,_unsigned_int>::TFlags(&local_84,&pAVar9->flags6);
        TFlags<ActorFlag6,_unsigned_int>::operator=(&(player->mo->super_AActor).flags6,&local_84);
        pAVar9 = AActor::GetDefault(&player->mo->super_AActor);
        TFlags<ActorFlag7,_unsigned_int>::TFlags(&local_88,&pAVar9->flags7);
        TFlags<ActorFlag7,_unsigned_int>::operator=(&(player->mo->super_AActor).flags7,&local_88);
        operator~((EnumType)&i_1);
        TFlags<ActorRenderFlag,_unsigned_int>::operator&=
                  (&(player->mo->super_AActor).renderflags,(Self *)&i_1);
        pAVar9 = AActor::GetDefault(&player->mo->super_AActor);
        (player->mo->super_AActor).Height = pAVar9->Height;
        pAVar9 = AActor::GetDefault(&player->mo->super_AActor);
        (player->mo->super_AActor).radius = pAVar9->radius;
        (player->mo->super_AActor).special1 = 0;
        AActor::SetState(&player->mo->super_AActor,(player->mo->super_AActor).SpawnState,false);
        TFlags<ActorFlag2,_unsigned_int>::operator&
                  (&local_90,(int)player->mo + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
        uVar5 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_90);
        if (uVar5 == 0) {
          DVar6 = TRANSLATION('\x01',(uint)((long)(player[-0xa3fb].weapons.Slots + 4) / 0x2a0) &
                                     0xff);
          (player->mo->super_AActor).Translation = DVar6;
        }
        FNameNoInit::operator=(&(player->mo->super_AActor).DamageType,NAME_None);
        if (player->ReadyWeapon != (AWeapon *)0x0) {
          state = AWeapon::GetUpState(player->ReadyWeapon);
          P_SetPsprite(player,PSP_WEAPON,state,false);
        }
        if (player->morphTics != 0) {
          P_UndoPlayerMorph(player,player,0,false);
        }
      }
    }
    break;
  case 0x24:
    player->cheats = player->cheats & 0xffffefbf;
    local_30 = "Frozen player properties turned off";
    break;
  case 0x25:
    bVar4 = (byte)bglobal._16_1_ >> 1 & 1 ^ 1;
    bVar13 = bglobal._16_1_ & 0xfd | bVar4 << 1;
    if ((bglobal._16_1_ & 1) == bVar4) {
      bglobal._16_1_ = bVar13;
      local_30 = FStringTable::operator()(&GStrings,"TXT_FREEZEOFF");
    }
    else {
      bglobal._16_1_ = bVar13;
      local_30 = FStringTable::operator()(&GStrings,"TXT_FREEZEON");
    }
    break;
  case 0x26:
    cht_Give(player,"ArtiInvulnerability",1);
    local_30 = "Valador\'s Ring of Invunerability";
    break;
  case 0x27:
    cht_Give(player,"ArtiInvisibility",1);
    local_30 = "Shadowsphere";
    break;
  case 0x28:
    cht_Give(player,"ArtiHealth",1);
    local_30 = "Quartz Flask";
    break;
  case 0x29:
    cht_Give(player,"ArtiSuperHealth",1);
    local_30 = "Mystic Urn";
    break;
  case 0x2a:
    cht_Give(player,"ArtiTomeOfPower",1);
    local_30 = "Tyketto\'s Tome of Power";
    break;
  case 0x2b:
    cht_Give(player,"ArtiTorch",1);
    local_30 = "Torch";
    break;
  case 0x2c:
    cht_Give(player,"ArtiTimeBomb",1);
    local_30 = "Delmintalintar\'s Time Bomb of the Ancients";
    break;
  case 0x2d:
    cht_Give(player,"ArtiEgg",1);
    local_30 = "Torpol\'s Morph Ovum";
    break;
  case 0x2e:
    cht_Give(player,"ArtiFly",1);
    local_30 = "Inhilicon\'s Wings of Wrath";
    break;
  case 0x2f:
    cht_Give(player,"ArtiTeleport",1);
    local_30 = "Darchala\'s Chaos Device";
    break;
  case 0x30:
    for (invp._4_4_ = 0; invp._4_4_ < 0x10; invp._4_4_ = invp._4_4_ + 1) {
      cht_Give(player,"artifacts",1);
    }
    local_30 = "All artifacts!";
    break;
  case 0x31:
    player->cheats = player->cheats ^ 0x8000000;
    if ((player->cheats & 0x8000000U) == 0) {
      local_30 = FStringTable::operator()(&GStrings,"TXT_BUDDHAOFF");
    }
    else {
      local_30 = FStringTable::operator()(&GStrings,"TXT_BUDDHAON");
    }
    break;
  case 0x32:
    player->cheats = player->cheats ^ 0x40000000;
    if ((player->cheats & 0x40000000U) == 0) {
      player->cheats = player->cheats & 0xfffffffe;
      local_30 = FStringTable::operator()(&GStrings,"STSTR_NCOFF");
    }
    else {
      player->cheats = player->cheats | 1;
      local_30 = FStringTable::operator()(&GStrings,"STSTR_NC2ON");
    }
    dVar1 = (player->mo->super_AActor).Vel.X;
    if ((dVar1 == 0.0) && (!NAN(dVar1))) {
      (player->mo->super_AActor).Vel.X = 1.52587890625e-05;
    }
    break;
  case 0x33:
    player->cheats = player->cheats ^ 0x1000000;
    if ((player->cheats & 0x1000000U) == 0) {
      local_30 = FStringTable::operator()(&GStrings,"TXT_BUDDHA2OFF");
    }
    else {
      local_30 = FStringTable::operator()(&GStrings,"TXT_BUDDHA2ON");
    }
    break;
  case 0x34:
    player->cheats = player->cheats ^ 0x2000000;
    if ((player->cheats & 0x2000000U) == 0) {
      local_30 = FStringTable::operator()(&GStrings,"STSTR_DQD2OFF");
    }
    else {
      local_30 = FStringTable::operator()(&GStrings,"STSTR_DQD2ON");
    }
    ST_SetNeedRefresh();
  }
  if (*local_30 != '\0') {
    if (player == (player_t *)(&players + (long)consoleplayer * 0x54)) {
      Printf("%s\n",local_30);
    }
    else if (cheat != 0x14) {
      pcVar12 = userinfo_t::GetName(&player->userinfo);
      Printf("%s cheats: %s\n",pcVar12,local_30);
    }
  }
  return;
}

Assistant:

void cht_DoCheat (player_t *player, int cheat)
{
	static const char * const BeholdPowers[9] =
	{
		"PowerInvulnerable",
		"PowerStrength",
		"PowerInvisibility",
		"PowerIronFeet",
		"MapRevealer",
		"PowerLightAmp",
		"PowerShadow",
		"PowerMask",
		"PowerTargeter",
	};
	PClassActor *type;
	AInventory *item;
	const char *msg = "";
	char msgbuild[32];
	int i;

	switch (cheat)
	{
	case CHT_IDDQD:
		if (!(player->cheats & CF_GODMODE) && player->playerstate == PST_LIVE)
		{
			if (player->mo)
				player->mo->health = deh.GodHealth;

			player->health = deh.GodHealth;
		}
		// fall through to CHT_GOD
	case CHT_GOD:
		player->cheats ^= CF_GODMODE;
		if (player->cheats & CF_GODMODE)
			msg = GStrings("STSTR_DQDON");
		else
			msg = GStrings("STSTR_DQDOFF");
		ST_SetNeedRefresh();
		break;

	case CHT_BUDDHA:
		player->cheats ^= CF_BUDDHA;
		if (player->cheats & CF_BUDDHA)
			msg = GStrings("TXT_BUDDHAON");
		else
			msg = GStrings("TXT_BUDDHAOFF");
		break;

	case CHT_GOD2:
		player->cheats ^= CF_GODMODE2;
		if (player->cheats & CF_GODMODE2)
			msg = GStrings("STSTR_DQD2ON");
		else
			msg = GStrings("STSTR_DQD2OFF");
		ST_SetNeedRefresh();
		break;

	case CHT_BUDDHA2:
		player->cheats ^= CF_BUDDHA2;
		if (player->cheats & CF_BUDDHA2)
			msg = GStrings("TXT_BUDDHA2ON");
		else
			msg = GStrings("TXT_BUDDHA2OFF");
		break;

	case CHT_NOCLIP:
		player->cheats ^= CF_NOCLIP;
		if (player->cheats & CF_NOCLIP)
			msg = GStrings("STSTR_NCON");
		else
			msg = GStrings("STSTR_NCOFF");
		break;

	case CHT_NOCLIP2:
		player->cheats ^= CF_NOCLIP2;
		if (player->cheats & CF_NOCLIP2)
		{
			player->cheats |= CF_NOCLIP;
			msg = GStrings("STSTR_NC2ON");
		}
		else
		{
			player->cheats &= ~CF_NOCLIP;
			msg = GStrings("STSTR_NCOFF");
		}
		if (player->mo->Vel.X == 0) player->mo->Vel.X = MinVel;	// force some lateral movement so that internal variables are up to date
		break;

	case CHT_NOVELOCITY:
		player->cheats ^= CF_NOVELOCITY;
		if (player->cheats & CF_NOVELOCITY)
			msg = GStrings("TXT_LEADBOOTSON");
		else
			msg = GStrings("TXT_LEADBOOTSOFF");
		break;

	case CHT_FLY:
		if (player->mo != NULL)
		{
			player->mo->flags7 ^= MF7_FLYCHEAT;
			if (player->mo->flags7 & MF7_FLYCHEAT)
			{
				player->mo->flags |= MF_NOGRAVITY;
				player->mo->flags2 |= MF2_FLY;
				msg = GStrings("TXT_LIGHTER");
			}
			else
			{
				player->mo->flags &= ~MF_NOGRAVITY;
				player->mo->flags2 &= ~MF2_FLY;
				msg = GStrings("TXT_GRAVITY");
			}
		}
		break;

	case CHT_MORPH:
		msg = cht_Morph (player, static_cast<PClassPlayerPawn *>(PClass::FindClass (gameinfo.gametype == GAME_Heretic ? NAME_ChickenPlayer : NAME_PigPlayer)), true);
		break;

	case CHT_NOTARGET:
		player->cheats ^= CF_NOTARGET;
		if (player->cheats & CF_NOTARGET)
			msg = "notarget ON";
		else
			msg = "notarget OFF";
		break;

	case CHT_ANUBIS:
		player->cheats ^= CF_FRIGHTENING;
		if (player->cheats & CF_FRIGHTENING)
			msg = "\"Quake with fear!\"";
		else
			msg = "No more ogre armor";
		break;

	case CHT_CHASECAM:
		player->cheats ^= CF_CHASECAM;
		if (player->cheats & CF_CHASECAM)
			msg = "chasecam ON";
		else
			msg = "chasecam OFF";
		R_ResetViewInterpolation ();
		break;

	case CHT_CHAINSAW:
		if (player->mo != NULL && player->health >= 0)
		{
			type = PClass::FindActor("Chainsaw");
			if (player->mo->FindInventory (type) == NULL)
			{
				player->mo->GiveInventoryType (type);
			}
			msg = GStrings("STSTR_CHOPPERS");
		}
		// [RH] The original cheat also set powers[pw_invulnerability] to true.
		// Since this is a timer and not a boolean, it effectively turned off
		// the invulnerability powerup, although it looks like it was meant to
		// turn it on.
		break;

	case CHT_POWER:
		if (player->mo != NULL && player->health >= 0)
		{
			item = player->mo->FindInventory (RUNTIME_CLASS(APowerWeaponLevel2), true);
			if (item != NULL)
			{
				item->Destroy ();
				msg = GStrings("TXT_CHEATPOWEROFF");
			}
			else
			{
				player->mo->GiveInventoryType (RUNTIME_CLASS(APowerWeaponLevel2));
				msg = GStrings("TXT_CHEATPOWERON");
			}
		}
		break;

	case CHT_IDKFA:
		cht_Give (player, "backpack");
		cht_Give (player, "weapons");
		cht_Give (player, "ammo");
		cht_Give (player, "keys");
		cht_Give (player, "armor");
		msg = GStrings("STSTR_KFAADDED");
		break;

	case CHT_IDFA:
		cht_Give (player, "backpack");
		cht_Give (player, "weapons");
		cht_Give (player, "ammo");
		cht_Give (player, "armor");
		msg = GStrings("STSTR_FAADDED");
		break;

	case CHT_BEHOLDV:
	case CHT_BEHOLDS:
	case CHT_BEHOLDI:
	case CHT_BEHOLDR:
	case CHT_BEHOLDA:
	case CHT_BEHOLDL:
	case CHT_PUMPUPI:
	case CHT_PUMPUPM:
	case CHT_PUMPUPT:
		i = cheat - CHT_BEHOLDV;

		if (i == 4)
		{
			level.flags2 ^= LEVEL2_ALLMAP;
		}
		else if (player->mo != NULL && player->health >= 0)
		{
			item = player->mo->FindInventory(PClass::FindActor(BeholdPowers[i]));
			if (item == NULL)
			{
				if (i != 0)
				{
					cht_Give(player, BeholdPowers[i]);
					if (cheat == CHT_BEHOLDS)
					{
						P_GiveBody (player->mo, -100);
					}
				}
				else
				{
					// Let's give the item here so that the power doesn't need colormap information.
					cht_Give(player, "InvulnerabilitySphere");
				}
			}
			else
			{
				item->Destroy ();
			}
		}
		msg = GStrings("STSTR_BEHOLDX");
		break;

	case CHT_MASSACRE:
		{
			int killcount = P_Massacre ();
			// killough 3/22/98: make more intelligent about plural
			// Ty 03/27/98 - string(s) *not* externalized
			mysnprintf (msgbuild, countof(msgbuild), "%d Monster%s Killed", killcount, killcount==1 ? "" : "s");
			msg = msgbuild;
		}
		break;

	case CHT_HEALTH:
		if (player->mo != NULL && player->playerstate == PST_LIVE)
		{
			player->health = player->mo->health = player->mo->GetDefault()->health;
			msg = GStrings("TXT_CHEATHEALTH");
		}
		break;

	case CHT_KEYS:
		cht_Give (player, "keys");
		msg = GStrings("TXT_CHEATKEYS");
		break;

	// [GRB]
	case CHT_RESSURECT:
		if (player->playerstate != PST_LIVE && player->mo != nullptr)
		{
			if (player->mo->IsKindOf(RUNTIME_CLASS(APlayerChunk)))
			{
				Printf("Unable to resurrect. Player is no longer connected to its body.\n");
			}
			else
			{
				player->playerstate = PST_LIVE;
				player->health = player->mo->health = player->mo->GetDefault()->health;
				player->viewheight = ((APlayerPawn *)player->mo->GetDefault())->ViewHeight;
				player->mo->flags = player->mo->GetDefault()->flags;
				player->mo->flags2 = player->mo->GetDefault()->flags2;
				player->mo->flags3 = player->mo->GetDefault()->flags3;
				player->mo->flags4 = player->mo->GetDefault()->flags4;
				player->mo->flags5 = player->mo->GetDefault()->flags5;
				player->mo->flags6 = player->mo->GetDefault()->flags6;
				player->mo->flags7 = player->mo->GetDefault()->flags7;
				player->mo->renderflags &= ~RF_INVISIBLE;
				player->mo->Height = player->mo->GetDefault()->Height;
				player->mo->radius = player->mo->GetDefault()->radius;
				player->mo->special1 = 0;	// required for the Hexen fighter's fist attack. 
											// This gets set by AActor::Die as flag for the wimpy death and must be reset here.
				player->mo->SetState (player->mo->SpawnState);
				if (!(player->mo->flags2 & MF2_DONTTRANSLATE))
				{
					player->mo->Translation = TRANSLATION(TRANSLATION_Players, BYTE(player-players));
				}
				player->mo->DamageType = NAME_None;
				if (player->ReadyWeapon != nullptr)
				{
					P_SetPsprite(player, PSP_WEAPON, player->ReadyWeapon->GetUpState());
				}

				if (player->morphTics)
				{
					P_UndoPlayerMorph(player, player);
				}

			}
		}
		break;

	case CHT_GIMMIEA:
		cht_Give (player, "ArtiInvulnerability");
		msg = "Valador's Ring of Invunerability";
		break;

	case CHT_GIMMIEB:
		cht_Give (player, "ArtiInvisibility");
		msg = "Shadowsphere";
		break;

	case CHT_GIMMIEC:
		cht_Give (player, "ArtiHealth");
		msg = "Quartz Flask";
		break;

	case CHT_GIMMIED:
		cht_Give (player, "ArtiSuperHealth");
		msg = "Mystic Urn";
		break;

	case CHT_GIMMIEE:
		cht_Give (player, "ArtiTomeOfPower");
		msg = "Tyketto's Tome of Power";
		break;

	case CHT_GIMMIEF:
		cht_Give (player, "ArtiTorch");
		msg = "Torch";
		break;

	case CHT_GIMMIEG:
		cht_Give (player, "ArtiTimeBomb");
		msg = "Delmintalintar's Time Bomb of the Ancients";
		break;

	case CHT_GIMMIEH:
		cht_Give (player, "ArtiEgg");
		msg = "Torpol's Morph Ovum";
		break;

	case CHT_GIMMIEI:
		cht_Give (player, "ArtiFly");
		msg = "Inhilicon's Wings of Wrath";
		break;

	case CHT_GIMMIEJ:
		cht_Give (player, "ArtiTeleport");
		msg = "Darchala's Chaos Device";
		break;

	case CHT_GIMMIEZ:
		for (int i=0;i<16;i++)
		{
			cht_Give (player, "artifacts");
		}
		msg = "All artifacts!";
		break;

	case CHT_TAKEWEAPS:
		if (player->morphTics || player->mo == NULL || player->mo->health <= 0)
		{
			return;
		}
		{
			// Take away all weapons that are either non-wimpy or use ammo.
			AInventory **invp = &player->mo->Inventory, **lastinvp;
			for (item = *invp; item != NULL; item = *invp)
			{
				lastinvp = invp;
				invp = &(*invp)->Inventory;
				if (item->IsKindOf (RUNTIME_CLASS(AWeapon)))
				{
					AWeapon *weap = static_cast<AWeapon *> (item);
					if (!(weap->WeaponFlags & WIF_WIMPY_WEAPON) ||
						weap->AmmoType1 != NULL)
					{
						item->Destroy ();
						invp = lastinvp;
					}
				}
			}
		}
		msg = GStrings("TXT_CHEATIDKFA");
		break;

	case CHT_NOWUDIE:
		cht_Suicide (player);
		msg = GStrings("TXT_CHEATIDDQD");
		break;

	case CHT_ALLARTI:
		for (int i=0;i<25;i++)
		{
			cht_Give (player, "artifacts");
		}
		msg = GStrings("TXT_CHEATARTIFACTS3");
		break;

	case CHT_PUZZLE:
		cht_Give (player, "puzzlepieces");
		msg = GStrings("TXT_CHEATARTIFACTS3");
		break;

	case CHT_MDK:
		if (player->mo == NULL)
		{
			Printf ("What do you want to kill outside of a game?\n");
		}
		else if (!deathmatch)
		{
			// Don't allow this in deathmatch even with cheats enabled, because it's
			// a very very cheap kill.
			P_LineAttack (player->mo, player->mo->Angles.Yaw, PLAYERMISSILERANGE,
				P_AimLineAttack (player->mo, player->mo->Angles.Yaw, PLAYERMISSILERANGE), TELEFRAG_DAMAGE,
				NAME_MDK, NAME_BulletPuff);
		}
		break;

	case CHT_DONNYTRUMP:
		cht_Give (player, "HealthTraining");
		msg = GStrings("TXT_MIDASTOUCH");
		break;

	case CHT_LEGO:
		if (player->mo != NULL && player->health >= 0)
		{
			static VMFunction *gsp = nullptr;
			if (gsp == nullptr) gsp = PClass::FindFunction(NAME_Sigil, NAME_GiveSigilPiece);
			if (gsp)
			{
				VMValue params[1] = { player->mo };
				VMReturn ret;
				int oldpieces = 1;
				ret.IntAt(&oldpieces);
				GlobalVMStack.Call(gsp, params, 1, &ret, 1, nullptr);
				item = player->mo->FindInventory(PClass::FindActor(NAME_Sigil));

				if (item != NULL)
				{
					if (oldpieces == 5)
					{
						item->Destroy();
					}
					else
					{
						player->PendingWeapon = static_cast<AWeapon *> (item);
					}
				}
			}
		}
		break;

	case CHT_PUMPUPH:
		cht_Give (player, "MedPatch");
		cht_Give (player, "MedicalKit");
		cht_Give (player, "SurgeryKit");
		msg = GStrings("TXT_GOTSTUFF");
		break;

	case CHT_PUMPUPP:
		cht_Give (player, "AmmoSatchel");
		msg = GStrings("TXT_GOTSTUFF");
		break;

	case CHT_PUMPUPS:
		cht_Give (player, "UpgradeStamina", 10);
		cht_Give (player, "UpgradeAccuracy");
		msg = GStrings("TXT_GOTSTUFF");
		break;

	case CHT_CLEARFROZENPROPS:
		player->cheats &= ~(CF_FROZEN|CF_TOTALLYFROZEN);
		msg = "Frozen player properties turned off";
		break;

	case CHT_FREEZE:
		bglobal.changefreeze ^= 1;
		if (bglobal.freeze ^ bglobal.changefreeze)
		{
			msg = GStrings("TXT_FREEZEON");
		}
		else
		{
			msg = GStrings("TXT_FREEZEOFF");
		}
		break;
	}

	if (!*msg)              // [SO] Don't print blank lines!
		return;

	if (player == &players[consoleplayer])
		Printf ("%s\n", msg);
	else if (cheat != CHT_CHASECAM)
		Printf ("%s cheats: %s\n", player->userinfo.GetName(), msg);
}